

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void write_buffer_16x16(__m128i *in,int32_t *output)

{
  write_buffer_8x8(in,output);
  write_buffer_8x8(in + 0x10,output + 0x40);
  write_buffer_8x8(in + 0x20,output + 0x80);
  write_buffer_8x8(in + 0x30,output + 0xc0);
  return;
}

Assistant:

static void write_buffer_16x16(const __m128i *in, int32_t *output) {
  const int size_8x8 = 16 * 4;
  write_buffer_8x8(&in[0], output);
  output += size_8x8;
  write_buffer_8x8(&in[16], output);
  output += size_8x8;
  write_buffer_8x8(&in[32], output);
  output += size_8x8;
  write_buffer_8x8(&in[48], output);
}